

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shmfilelockmgr.cpp
# Opt level: O3

PAL_ERROR __thiscall
CorUnix::CSharedMemoryFileLockController::ReleaseFileLock
          (CSharedMemoryFileLockController *this,CPalThread *pThread,DWORD dwOffsetLow,
          DWORD dwOffsetHigh,DWORD nNumberOfBytesToUnlockLow,DWORD nNumberOfBytesToUnlockHigh)

{
  PAL_ERROR PVar1;
  
  PVar1 = FILEUnlockFileRegion
                    (this->m_shmFileLocks,this,CONCAT44(dwOffsetHigh,dwOffsetLow),
                     CONCAT44(nNumberOfBytesToUnlockHigh,nNumberOfBytesToUnlockLow),USER_LOCK_RGN);
  return PVar1;
}

Assistant:

PAL_ERROR
CSharedMemoryFileLockController::ReleaseFileLock(
    CPalThread *pThread,                // IN, OPTIONAL
    DWORD dwOffsetLow,
    DWORD dwOffsetHigh,
    DWORD nNumberOfBytesToUnlockLow,
    DWORD nNumberOfBytesToUnlockHigh
    )
{
    PAL_ERROR palError = NO_ERROR;
    UINT64 unlockRgnStart;
    UINT64 nbBytesToUnlock;

    unlockRgnStart  = ((UINT64)dwOffsetHigh) << 32  | dwOffsetLow;
    nbBytesToUnlock = ((UINT64)nNumberOfBytesToUnlockHigh) << 32  | 
                             nNumberOfBytesToUnlockLow;

    palError = FILEUnlockFileRegion(
        m_shmFileLocks,
        reinterpret_cast<PVOID>(this),
        unlockRgnStart, 
        nbBytesToUnlock,
        USER_LOCK_RGN
        );

    return palError;
}